

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.h
# Opt level: O0

int av1_frame_allows_smart_mv(AV1_COMP *cpi)

{
  char cVar1;
  int iVar2;
  long *in_RDI;
  int gf_update_type;
  int gf_group_index;
  bool local_12;
  byte local_11;
  
  cVar1 = *(char *)(*in_RDI + 400 + (long)(int)(uint)*(byte *)(in_RDI + 0xe258));
  iVar2 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x77f0));
  local_11 = 0;
  if (iVar2 == 0) {
    local_12 = cVar1 == '\x05' || cVar1 == '\x04';
    local_11 = local_12 ^ 0xff;
  }
  return (int)(local_11 & 1);
}

Assistant:

static inline int av1_frame_allows_smart_mv(const AV1_COMP *cpi) {
  const int gf_group_index = cpi->gf_frame_index;
  const int gf_update_type = cpi->ppi->gf_group.update_type[gf_group_index];
  return !frame_is_intra_only(&cpi->common) &&
         !(gf_update_type == INTNL_OVERLAY_UPDATE ||
           gf_update_type == OVERLAY_UPDATE);
}